

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::FloatDatatypeValidator::checkContent
          (FloatDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  DatatypeValidator *pDVar4;
  RegularExpression *this_00;
  InvalidDatatypeValueException *pIVar5;
  XMLCh *text2;
  RefVectorOf<xercesc_4_0::XMLNumber> *pRVar6;
  BaseRefVectorOf<xercesc_4_0::XMLNumber> *pBVar7;
  XMLSize_t XVar8;
  XMLNumber *pXVar9;
  XMLSize_t enumLength;
  XMLSize_t i;
  XMLFloat *theData;
  XMLFloat theValue;
  FloatDatatypeValidator *pBase;
  MemoryManager *manager_local;
  bool asBase_local;
  ValidationContext *context_local;
  XMLCh *content_local;
  FloatDatatypeValidator *this_local;
  
  pDVar4 = DatatypeValidator::getBaseValidator((DatatypeValidator *)this);
  if (pDVar4 != (DatatypeValidator *)0x0) {
    (*(pDVar4->super_XSerializable)._vptr_XSerializable[0x11])(pDVar4,content,context,1,manager);
  }
  uVar2 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this);
  if ((uVar2 & 8) != 0) {
    this_00 = DatatypeValidator::getRegex((DatatypeValidator *)this);
    bVar1 = RegularExpression::matches(this_00,content,manager);
    if (!bVar1) {
      pIVar5 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      text2 = DatatypeValidator::getPattern((DatatypeValidator *)this);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (pIVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/FloatDatatypeValidator.cpp"
                 ,0xc4,VALUE_NotMatch_Pattern,content,text2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar5,&InvalidDatatypeValueException::typeinfo,
                  InvalidDatatypeValueException::~InvalidDatatypeValueException);
    }
  }
  if (!asBase) {
    XMLFloat::XMLFloat((XMLFloat *)&theData,content,manager);
    pRVar6 = AbstractNumericFacetValidator::getEnumeration((AbstractNumericFacetValidator *)this);
    if (pRVar6 != (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0) {
      enumLength = 0;
      pBVar7 = &AbstractNumericFacetValidator::getEnumeration((AbstractNumericFacetValidator *)this)
                ->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
      XVar8 = BaseRefVectorOf<xercesc_4_0::XMLNumber>::size(pBVar7);
      for (; enumLength < XVar8; enumLength = enumLength + 1) {
        pBVar7 = &AbstractNumericFacetValidator::getEnumeration
                            ((AbstractNumericFacetValidator *)this)->
                  super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
        pXVar9 = BaseRefVectorOf<xercesc_4_0::XMLNumber>::elementAt(pBVar7,enumLength);
        iVar3 = (*(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                  super_DatatypeValidator.super_XSerializable._vptr_XSerializable[0x10])
                          (this,(XMLFloat *)&theData,pXVar9);
        if (iVar3 == 0) break;
      }
      if (enumLength == XVar8) {
        pIVar5 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/FloatDatatypeValidator.cpp"
                   ,0xdb,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar5,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
    AbstractNumericValidator::boundsCheck
              (&this->super_AbstractNumericValidator,(XMLNumber *)&theData,manager);
    XMLFloat::~XMLFloat((XMLFloat *)&theData);
  }
  return;
}

Assistant:

void FloatDatatypeValidator::checkContent(const XMLCh*             const content
                                         ,      ValidationContext* const context
                                         ,      bool                     asBase
                                         ,      MemoryManager*     const manager)
{

    //validate against base validator if any
    FloatDatatypeValidator *pBase = (FloatDatatypeValidator*) this->getBaseValidator();
    if (pBase)
        pBase->checkContent(content, context, true, manager);

    // we check pattern first
    if ( (getFacetsDefined() & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    XMLFloat theValue(content, manager);
    XMLFloat *theData = &theValue;

    if (getEnumeration() != 0)
    {
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (compareValues(theData, (XMLFloat*) getEnumeration()->elementAt(i))==0)
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }

    boundsCheck(theData, manager);
}